

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_dynlink_path_test.cpp
# Opt level: O1

void __thiscall
metacall_dynlink_path_test_DefaultConstructor_Test::TestBody
          (metacall_dynlink_path_test_DefaultConstructor_Test *this)

{
  undefined8 *puVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  size_t length;
  char name [9];
  dynlink_library_path_str path;
  Message local_1060;
  AssertHelper local_1058;
  internal local_1050 [8];
  undefined8 *local_1048;
  undefined8 local_1040;
  undefined8 local_1038;
  undefined1 local_1030;
  undefined1 local_1028 [4104];
  
  metacall_print_info();
  local_1038 = 0x6c6c61636174656d;
  local_1030 = 0;
  local_1040 = 0;
  puts("/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O1");
  fflush(_stdout);
  local_1060.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_1058.data_._0_4_ = dynlink_library_path(&local_1038,local_1028,&local_1040);
  testing::internal::CmpHelperEQ<int,int>
            (local_1050,"(int)0","(int)dynlink_library_path(name, path, &length)",(int *)&local_1060
             ,(int *)&local_1058);
  puVar1 = local_1048;
  if (local_1050[0] == (internal)0x0) {
    testing::Message::Message(&local_1060);
    if (local_1048 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_1048;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1058,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_dynlink_path_test/source/metacall_dynlink_path_test.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1058,&local_1060);
  }
  else {
    if (local_1048 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1048 != local_1048 + 2) {
        operator_delete((undefined8 *)*local_1048);
      }
      operator_delete(puVar1);
    }
    printf("%s == %s\n",local_1028,
           "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O1");
    fflush(_stdout);
    local_1060.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    local_1058.data_._0_4_ =
         portability_path_compare
                   (local_1028,
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O1");
    testing::internal::CmpHelperEQ<int,int>
              (local_1050,"(int)0",
               "(int)portability_path_compare(path, \"/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O1\")"
               ,(int *)&local_1060,(int *)&local_1058);
    if (local_1050[0] != (internal)0x0) goto LAB_001085ea;
    testing::Message::Message(&local_1060);
    if (local_1048 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_1048;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1058,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_dynlink_path_test/source/metacall_dynlink_path_test.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1058,&local_1060);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_1058);
  if ((long *)CONCAT44(local_1060.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_1060.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_1060.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_1060.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
LAB_001085ea:
  if (local_1048 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1048 != local_1048 + 2) {
      operator_delete((undefined8 *)*local_1048);
    }
    operator_delete(local_1048);
  }
  return;
}

Assistant:

TEST_F(metacall_dynlink_path_test, DefaultConstructor)
{
	metacall_print_info();

	dynlink_library_path_str path;

	const char name[] = "metacall"
#if (!defined(NDEBUG) || defined(DEBUG) || defined(_DEBUG) || defined(__DEBUG) || defined(__DEBUG__))
						"d"
#endif
		;

	size_t length = 0;

	printf(METACALL_LIBRARY_PATH "\n");
	fflush(stdout);

	ASSERT_EQ((int)0, (int)dynlink_library_path(name, path, &length));

	printf("%s == %s\n", path, METACALL_LIBRARY_PATH);
	fflush(stdout);

	ASSERT_EQ((int)0, (int)portability_path_compare(path, METACALL_LIBRARY_PATH));
}